

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  size_t unaff_R13;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameHeader zfh;
  uint local_84;
  long local_80;
  ZSTD_frameSizeInfo local_78;
  ZSTD_frameHeader local_60;
  
  local_80 = 0;
  local_84 = 0;
  do {
    if (srcSize == 0) {
      return local_80 + (ulong)local_84;
    }
    bVar1 = false;
    ZSTD_findFrameSizeInfo(&local_78,src,srcSize,ZSTD_f_zstd1);
    uVar3 = local_78.decompressedBound;
    sVar2 = local_78.compressedSize;
    sVar4 = ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
    if (sVar4 < 0xffffffffffffff89) {
      bVar1 = false;
      if ((sVar2 < 0xffffffffffffff89) && (uVar3 != 0xfffffffffffffffe)) {
        if (local_60.frameType == ZSTD_frame) {
          local_80 = local_78.nbBlocks * 3 +
                     local_80 + (ulong)local_60.headerSize + (ulong)(local_60.checksumFlag != 0) * 4
          ;
          if (local_84 <= local_60.blockSizeMax) {
            local_84 = local_60.blockSizeMax;
          }
        }
        else {
          local_80 = local_80 + sVar2;
        }
        src = (void *)((long)src + sVar2);
        srcSize = srcSize - sVar2;
        bVar1 = true;
        sVar4 = unaff_R13;
      }
      else {
        sVar4 = 0xffffffffffffffec;
      }
    }
    unaff_R13 = sVar4;
  } while (bVar1);
  return sVar4;
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize, ZSTD_f_zstd1);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}